

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

string * __thiscall
google::protobuf::FieldDescriptor::DefaultValueAsString_abi_cxx11_
          (string *__return_storage_ptr__,FieldDescriptor *this,bool quote_string_type)

{
  CppType CVar1;
  Type TVar2;
  LogMessage *pLVar3;
  EnumValueDescriptor *pEVar4;
  AlphaNum *extraout_RDX;
  AlphaNum *extraout_RDX_00;
  AlphaNum *extraout_RDX_01;
  AlphaNum *extraout_RDX_02;
  AlphaNum *a;
  char *pcVar5;
  string *src;
  LogMessage LStack_78;
  string local_40;
  
  pLVar3 = (LogMessage *)this;
  if (this[0x40] == (FieldDescriptor)0x0) {
    internal::LogMessage::LogMessage
              (&LStack_78,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
               ,0x797);
    pLVar3 = internal::LogMessage::operator<<(&LStack_78,"CHECK failed: has_default_value(): ");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,"No default value");
    internal::LogFinisher::operator=((LogFinisher *)&local_40,pLVar3);
    internal::LogMessage::~LogMessage(&LStack_78);
  }
  CVar1 = cpp_type(this);
  switch(CVar1) {
  case CPPTYPE_INT32:
    strings::AlphaNum::AlphaNum((AlphaNum *)&LStack_78,*(int *)(this + 0x90));
    a = extraout_RDX;
    break;
  case CPPTYPE_INT64:
    strings::AlphaNum::AlphaNum((AlphaNum *)&LStack_78,*(long *)(this + 0x90));
    a = extraout_RDX_02;
    break;
  case CPPTYPE_UINT32:
    strings::AlphaNum::AlphaNum((AlphaNum *)&LStack_78,*(uint *)(this + 0x90));
    a = extraout_RDX_00;
    break;
  case CPPTYPE_UINT64:
    strings::AlphaNum::AlphaNum((AlphaNum *)&LStack_78,*(unsigned_long *)(this + 0x90));
    a = extraout_RDX_01;
    break;
  case CPPTYPE_DOUBLE:
    SimpleDtoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)pLVar3,*(double *)(this + 0x90));
    return __return_storage_ptr__;
  case CPPTYPE_FLOAT:
    SimpleFtoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)pLVar3,*(float *)(this + 0x90));
    return __return_storage_ptr__;
  case CPPTYPE_BOOL:
    pcVar5 = "false";
    if (this[0x90] != (FieldDescriptor)0x0) {
      pcVar5 = "true";
    }
    goto LAB_0029ab86;
  case CPPTYPE_ENUM:
    pEVar4 = default_value_enum(this);
    src = *(string **)pEVar4;
    goto LAB_0029ab30;
  case CPPTYPE_STRING:
    if (quote_string_type) {
      CEscape(&local_40,*(string **)(this + 0x90));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&LStack_78
                     ,"\"",&local_40);
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&LStack_78
                     ,"\"");
      std::__cxx11::string::~string((string *)&LStack_78);
      std::__cxx11::string::~string((string *)&local_40);
      return __return_storage_ptr__;
    }
    TVar2 = type(this);
    src = *(string **)(this + 0x90);
    if (TVar2 == TYPE_BYTES) {
      CEscape(__return_storage_ptr__,src);
      return __return_storage_ptr__;
    }
LAB_0029ab30:
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)src);
    return __return_storage_ptr__;
  case CPPTYPE_MESSAGE:
    internal::LogMessage::LogMessage
              (&LStack_78,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
               ,0x7bd);
    pLVar3 = internal::LogMessage::operator<<(&LStack_78,"Messages can\'t have default values!");
    internal::LogFinisher::operator=((LogFinisher *)&local_40,pLVar3);
    internal::LogMessage::~LogMessage(&LStack_78);
  default:
    internal::LogMessage::LogMessage
              (&LStack_78,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
               ,0x7c0);
    pLVar3 = internal::LogMessage::operator<<
                       (&LStack_78,"Can\'t get here: failed to get default value as string");
    internal::LogFinisher::operator=((LogFinisher *)&local_40,pLVar3);
    internal::LogMessage::~LogMessage(&LStack_78);
    pcVar5 = anon_var_dwarf_3678a9 + 0x11;
LAB_0029ab86:
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar5,(allocator *)&LStack_78);
    return __return_storage_ptr__;
  }
  StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&LStack_78,a);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldDescriptor::DefaultValueAsString(
    bool quote_string_type) const {
  GOOGLE_CHECK(has_default_value()) << "No default value";
  switch (cpp_type()) {
    case CPPTYPE_INT32:
      return StrCat(default_value_int32());
      break;
    case CPPTYPE_INT64:
      return StrCat(default_value_int64());
      break;
    case CPPTYPE_UINT32:
      return StrCat(default_value_uint32());
      break;
    case CPPTYPE_UINT64:
      return StrCat(default_value_uint64());
      break;
    case CPPTYPE_FLOAT:
      return SimpleFtoa(default_value_float());
      break;
    case CPPTYPE_DOUBLE:
      return SimpleDtoa(default_value_double());
      break;
    case CPPTYPE_BOOL:
      return default_value_bool() ? "true" : "false";
      break;
    case CPPTYPE_STRING:
      if (quote_string_type) {
        return "\"" + CEscape(default_value_string()) + "\"";
      } else {
        if (type() == TYPE_BYTES) {
          return CEscape(default_value_string());
        } else {
          return default_value_string();
        }
      }
      break;
    case CPPTYPE_ENUM:
      return default_value_enum()->name();
      break;
    case CPPTYPE_MESSAGE:
      GOOGLE_LOG(DFATAL) << "Messages can't have default values!";
      break;
  }
  GOOGLE_LOG(FATAL) << "Can't get here: failed to get default value as string";
  return "";
}